

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ILBDOperator.cpp
# Opt level: O0

void __thiscall lts2::LBDOperator::recordBasisMovie(LBDOperator *this,string *movieName)

{
  undefined4 uVar1;
  _InputArray *p_Var2;
  int iVar3;
  _InputArray local_218;
  _InputArray local_200;
  _OutputArray local_1e8;
  _InputArray local_1d0;
  uint local_1b4;
  double dStack_1b0;
  int i;
  double bmax;
  double bmin;
  Size_<int> local_170;
  undefined1 local_168 [8];
  Mat basisImage;
  Mat local_108 [8];
  Mat grayFrame;
  Mat local_a8 [8];
  Mat currrentFrame;
  Size_<int> local_48;
  VideoWriter local_40 [8];
  VideoWriter movie;
  string *movieName_local;
  LBDOperator *this_local;
  
  uVar1 = cv::VideoWriter::fourcc('m','p','4','v');
  cv::Size_<int>::Size_(&local_48,&this->_patchSize);
  cv::VideoWriter::VideoWriter
            ((VideoWriter *)0x4000000000000000,local_40,movieName,uVar1,&local_48,1);
  cv::Mat::Mat(local_a8);
  cv::Mat::Mat(local_108);
  cv::Size_<int>::Size_(&local_170,&this->_patchSize);
  cv::Scalar_<double>::Scalar_((Scalar_<double> *)&bmin,0.0);
  cv::Mat::Mat((Mat *)local_168,&local_170,5,&bmin);
  for (local_1b4 = 0; local_1b4 < *(uint *)&(this->super_LinearOperator).field_0xc;
      local_1b4 = local_1b4 + 1) {
    fillBasisFunctionForIndex(this,(Mat *)local_168,local_1b4);
    cv::_InputArray::_InputArray(&local_1d0,(Mat *)local_168);
    p_Var2 = (_InputArray *)cv::noArray();
    iVar3 = 0;
    cv::minMaxLoc(&local_1d0,&bmax,&stack0xfffffffffffffe50,(Point_ *)0x0,(Point_ *)0x0,p_Var2);
    cv::_InputArray::~_InputArray(&local_1d0);
    cv::_OutputArray::_OutputArray(&local_1e8,local_108);
    cv::Mat::convertTo((_OutputArray *)local_168,(int)&local_1e8,255.0 / (dStack_1b0 - bmax),
                       (bmax * -255.0) / (dStack_1b0 - bmax));
    cv::_OutputArray::~_OutputArray(&local_1e8);
    cv::_InputArray::_InputArray(&local_200,local_108);
    cv::_OutputArray::_OutputArray((_OutputArray *)&local_218,local_a8);
    cv::cvtColor((cv *)&local_200,&local_218,(_OutputArray *)0x8,0,iVar3);
    cv::_OutputArray::~_OutputArray((_OutputArray *)&local_218);
    cv::_InputArray::~_InputArray(&local_200);
    cv::VideoWriter::operator<<(local_40,local_a8);
  }
  cv::Mat::~Mat((Mat *)local_168);
  cv::Mat::~Mat(local_108);
  cv::Mat::~Mat(local_a8);
  cv::VideoWriter::~VideoWriter(local_40);
  return;
}

Assistant:

void lts2::LBDOperator::recordBasisMovie(std::string const& movieName)
{
  cv::VideoWriter movie(movieName, cv::VideoWriter::fourcc('m', 'p', '4', 'v'), 2.0, _patchSize);
    
    cv::Mat currrentFrame, grayFrame;
    cv::Mat basisImage(_patchSize, CV_32F, cv::Scalar(0));
    
    double bmin, bmax;
    
    for (int i = 0; i < _pairsInUse; ++i)
    {
        // Fill basis image
        fillBasisFunctionForIndex(basisImage, i);
        cv::minMaxLoc(basisImage, &bmin, &bmax);
        
        // Convert to uchar
        basisImage.convertTo(grayFrame, CV_8U, 255.0/(bmax-bmin), -255.0*bmin/(bmax-bmin));
        
        // Color
        cv::cvtColor(grayFrame, currrentFrame, cv::COLOR_GRAY2BGR);
        
        movie << currrentFrame;
    }
}